

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaIDCFreeMatcherList(xmlSchemaIDCMatcherPtr_conflict matcher)

{
  xmlSchemaIDCMatcherPtr pxVar1;
  void *pvVar2;
  xmlSchemaPSVIIDCNodePtr idcNode;
  int i_1;
  int i;
  xmlSchemaIDCMatcherPtr_conflict next;
  xmlSchemaIDCMatcherPtr_conflict matcher_local;
  
  next = matcher;
  while (next != (xmlSchemaIDCMatcherPtr_conflict)0x0) {
    pxVar1 = next->next;
    if (next->keySeqs != (xmlSchemaPSVIIDCKeyPtr **)0x0) {
      for (idcNode._4_4_ = 0; idcNode._4_4_ < next->sizeKeySeqs; idcNode._4_4_ = idcNode._4_4_ + 1)
      {
        if (next->keySeqs[idcNode._4_4_] != (xmlSchemaPSVIIDCKeyPtr *)0x0) {
          (*xmlFree)(next->keySeqs[idcNode._4_4_]);
        }
      }
      (*xmlFree)(next->keySeqs);
    }
    if (next->targets != (xmlSchemaItemListPtr)0x0) {
      if (next->idcType == 0x18) {
        for (idcNode._0_4_ = 0; (int)idcNode < next->targets->nbItems;
            idcNode._0_4_ = (int)idcNode + 1) {
          pvVar2 = next->targets->items[(int)idcNode];
          (*xmlFree)(*(void **)((long)pvVar2 + 8));
          (*xmlFree)(pvVar2);
        }
      }
      xmlSchemaItemListFree(next->targets);
    }
    if (next->htab != (xmlHashTablePtr)0x0) {
      xmlHashFree(next->htab,xmlFreeIDCHashEntry);
    }
    (*xmlFree)(next);
    next = pxVar1;
  }
  return;
}

Assistant:

static void
xmlSchemaIDCFreeMatcherList(xmlSchemaIDCMatcherPtr matcher)
{
    xmlSchemaIDCMatcherPtr next;

    while (matcher != NULL) {
	next = matcher->next;
	if (matcher->keySeqs != NULL) {
	    int i;
	    for (i = 0; i < matcher->sizeKeySeqs; i++)
		if (matcher->keySeqs[i] != NULL)
		    xmlFree(matcher->keySeqs[i]);
	    xmlFree(matcher->keySeqs);
	}
	if (matcher->targets != NULL) {
	    if (matcher->idcType == XML_SCHEMA_TYPE_IDC_KEYREF) {
		int i;
		xmlSchemaPSVIIDCNodePtr idcNode;
		/*
		* Node-table items for keyrefs are not stored globally
		* to the validation context, since they are not bubbled.
		* We need to free them here.
		*/
		for (i = 0; i < matcher->targets->nbItems; i++) {
		    idcNode =
			(xmlSchemaPSVIIDCNodePtr) matcher->targets->items[i];
		    xmlFree(idcNode->keys);
		    xmlFree(idcNode);
		}
	    }
	    xmlSchemaItemListFree(matcher->targets);
	}
	if (matcher->htab != NULL)
	  xmlHashFree(matcher->htab, xmlFreeIDCHashEntry);
	xmlFree(matcher);
	matcher = next;
    }
}